

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int luaO_int2fb(uint x)

{
  undefined4 local_14;
  undefined4 local_10;
  int e;
  uint x_local;
  
  local_14 = 0;
  local_10 = x;
  e = x;
  if (7 < x) {
    for (; 0x7f < local_10; local_10 = local_10 + 0xf >> 4) {
      local_14 = local_14 + 4;
    }
    for (; 0xf < local_10; local_10 = local_10 + 1 >> 1) {
      local_14 = local_14 + 1;
    }
    e = (local_14 + 1) * 8 | local_10 - 8;
  }
  return e;
}

Assistant:

int luaO_int2fb (unsigned int x) {
  int e = 0;  /* exponent */
  if (x < 8) return x;
  while (x >= (8 << 4)) {  /* coarse steps */
    x = (x + 0xf) >> 4;  /* x = ceil(x / 16) */
    e += 4;
  }
  while (x >= (8 << 1)) {  /* fine steps */
    x = (x + 1) >> 1;  /* x = ceil(x / 2) */
    e++;
  }
  return ((e+1) << 3) | (cast_int(x) - 8);
}